

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O0

JSONValue * JSONValue::Parse(wchar_t **data)

{
  wchar_t *pwVar1;
  mapped_type pJVar2;
  bool bVar3;
  int iVar4;
  reference ppVar5;
  size_type sVar6;
  mapped_type *ppJVar7;
  reference ppJVar8;
  size_type sVar9;
  wchar_t **in_RDI;
  iterator iter_13;
  iterator iter_12;
  iterator iter_11;
  iterator iter_10;
  JSONValue *value_2;
  iterator iter_9;
  JSONArray array;
  iterator iter_8;
  iterator iter_7;
  iterator iter_6;
  iterator iter_5;
  JSONValue *value_1;
  iterator iter_4;
  iterator iter_3;
  iterator iter_2;
  iterator iter_1;
  wstring name;
  iterator iter;
  JSONObject object;
  double i;
  double expo;
  bool neg_expo;
  double decimal;
  double number;
  bool neg;
  bool value;
  wstring str;
  JSONValue *in_stack_fffffffffffffc08;
  JSONValue *in_stack_fffffffffffffc10;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
  *in_stack_fffffffffffffc18;
  JSONValue *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  JSONValue *in_stack_fffffffffffffc30;
  JSONValue *pJVar10;
  key_type *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  JSONValue *in_stack_fffffffffffffc70;
  double local_2e8;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_> local_2a0
  ;
  JSONValue **local_298;
  JSONValue **local_290;
  JSONValue **local_288;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_> local_280
  ;
  JSONValue **local_278;
  JSONValue **local_270;
  JSONValue **local_268;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_> local_260
  ;
  JSONValue **local_258;
  JSONValue **local_250;
  JSONValue **local_248;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_> local_240
  ;
  JSONValue *local_238;
  JSONValue **local_230;
  JSONValue **local_228;
  JSONValue **local_220;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_> local_218
  ;
  vector<JSONValue_*,_std::allocator<JSONValue_*>_> local_210;
  _Base_ptr local_1f8;
  _Self local_1f0;
  _Base_ptr local_1e8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_1e0;
  _Base_ptr local_1d8;
  _Self local_1d0;
  _Base_ptr local_1c8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_1c0;
  _Base_ptr local_1b8;
  _Self local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_1a0;
  _Self local_198;
  _Self local_190;
  _Base_ptr local_188;
  _Self local_180;
  _Base_ptr local_178;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_170;
  JSONValue *local_168;
  _Base_ptr local_160;
  _Self local_158;
  _Base_ptr local_150;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_148;
  _Base_ptr local_140;
  _Self local_138;
  _Base_ptr local_130;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_128;
  _Base_ptr local_120;
  _Self local_118;
  _Base_ptr local_110;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_108;
  _Base_ptr local_100;
  _Self local_f8;
  _Base_ptr local_f0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_e8;
  wstring local_e0 [32];
  _Base_ptr local_c0;
  _Self local_b8;
  _Base_ptr local_b0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_a8 [7];
  double local_70;
  double local_68;
  bool local_59;
  double local_58;
  double local_50;
  byte local_42;
  byte local_41;
  int local_40;
  wstring local_30 [24];
  wchar_t **in_stack_ffffffffffffffe8;
  JSONValue *local_8;
  
  if (**in_RDI == L'\"') {
    std::__cxx11::wstring::wstring(local_30);
    *in_RDI = *in_RDI + 1;
    bVar3 = JSON::ExtractString((wchar_t **)in_stack_fffffffffffffc18,
                                (wstring *)in_stack_fffffffffffffc10);
    if (bVar3) {
      local_8 = (JSONValue *)operator_new(0x10);
      JSONValue(in_stack_fffffffffffffc30,
                (wstring *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
    }
    else {
      local_8 = (JSONValue *)0x0;
    }
    local_40 = 1;
    std::__cxx11::wstring::~wstring(local_30);
  }
  else {
    bVar3 = simplejson_wcsnlen(*in_RDI,4);
    if (((bVar3) && (iVar4 = wcsncasecmp(*in_RDI,L"true",4), iVar4 == 0)) ||
       ((bVar3 = simplejson_wcsnlen(*in_RDI,5), bVar3 &&
        (iVar4 = wcsncasecmp(*in_RDI,L"false",5), iVar4 == 0)))) {
      iVar4 = wcsncasecmp(*in_RDI,L"true",4);
      local_41 = iVar4 == 0;
      *in_RDI = *in_RDI + (ulong)((byte)~local_41 & 1) + 4;
      local_8 = (JSONValue *)operator_new(0x10);
      JSONValue(local_8,(bool)(local_41 & 1));
    }
    else {
      bVar3 = simplejson_wcsnlen(*in_RDI,4);
      if ((bVar3) && (iVar4 = wcsncasecmp(*in_RDI,L"null",4), iVar4 == 0)) {
        *in_RDI = *in_RDI + 4;
        local_8 = (JSONValue *)operator_new(0x10);
        JSONValue(local_8);
      }
      else if ((**in_RDI == L'-') || ((L'/' < **in_RDI && (**in_RDI < L':')))) {
        local_42 = **in_RDI == L'-';
        if ((bool)local_42) {
          *in_RDI = *in_RDI + 1;
        }
        local_50 = 0.0;
        if (**in_RDI == L'0') {
          *in_RDI = *in_RDI + 1;
        }
        else {
          if ((**in_RDI < L'1') || (L'9' < **in_RDI)) {
            return (JSONValue *)0x0;
          }
          local_50 = JSON::ParseInt(in_RDI);
        }
        if (**in_RDI == L'.') {
          *in_RDI = *in_RDI + 1;
          if ((**in_RDI < L'0') || (L'9' < **in_RDI)) {
            return (JSONValue *)0x0;
          }
          local_58 = JSON::ParseDecimal(in_RDI);
          local_50 = local_58 + local_50;
        }
        if ((**in_RDI == L'E') || (**in_RDI == L'e')) {
          *in_RDI = *in_RDI + 1;
          local_59 = false;
          if ((**in_RDI == L'-') || (**in_RDI == L'+')) {
            local_59 = **in_RDI == L'-';
            *in_RDI = *in_RDI + 1;
          }
          if ((**in_RDI < L'0') || (L'9' < **in_RDI)) {
            return (JSONValue *)0x0;
          }
          local_68 = JSON::ParseInt(in_RDI);
          for (local_70 = 0.0; local_70 < local_68; local_70 = local_70 + 1.0) {
            if ((local_59 & 1U) == 0) {
              local_2e8 = local_50 * 10.0;
            }
            else {
              local_2e8 = local_50 / 10.0;
            }
            local_50 = local_2e8;
          }
        }
        if ((local_42 & 1) != 0) {
          local_50 = local_50 * -1.0;
        }
        local_8 = (JSONValue *)operator_new(0x10);
        JSONValue(local_8,local_50);
      }
      else {
        if (**in_RDI == L'{') {
          std::
          map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
          ::map((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                 *)0x2592c6);
          *in_RDI = *in_RDI + 1;
          while (**in_RDI != L'\0') {
            bVar3 = JSON::SkipWhitespace(in_RDI);
            if (!bVar3) {
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
              ::_Rb_tree_iterator(local_a8);
              local_b0 = (_Base_ptr)
                         std::
                         map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                         ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                  *)in_stack_fffffffffffffc08);
              local_a8[0]._M_node = local_b0;
              while( true ) {
                local_b8._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                     ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                            *)in_stack_fffffffffffffc08);
                bVar3 = std::operator!=(local_a8,&local_b8);
                if (!bVar3) break;
                ppVar5 = std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                         ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                      *)0x259382);
                pJVar10 = ppVar5->second;
                if (pJVar10 != (JSONValue *)0x0) {
                  ~JSONValue(in_stack_fffffffffffffc70);
                  operator_delete(pJVar10);
                }
                local_c0 = (_Base_ptr)
                           std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                           ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                         *)in_stack_fffffffffffffc18,
                                        (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
              }
              local_8 = (JSONValue *)0x0;
              local_40 = 1;
              goto LAB_00259e31;
            }
            sVar6 = std::
                    map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                    ::size((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                            *)0x25940e);
            if ((sVar6 == 0) && (**in_RDI == L'}')) {
              *in_RDI = *in_RDI + 1;
              local_8 = (JSONValue *)operator_new(0x10);
              JSONValue(in_stack_fffffffffffffc30,
                        (JSONObject *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28))
              ;
              local_40 = 1;
              goto LAB_00259e31;
            }
            std::__cxx11::wstring::wstring(local_e0);
            *in_RDI = *in_RDI + 1;
            bVar3 = JSON::ExtractString((wchar_t **)in_stack_fffffffffffffc18,
                                        (wstring *)in_stack_fffffffffffffc10);
            if (bVar3) {
              bVar3 = JSON::SkipWhitespace(in_RDI);
              if (bVar3) {
                pwVar1 = *in_RDI;
                *in_RDI = pwVar1 + 1;
                if (*pwVar1 == L':') {
                  bVar3 = JSON::SkipWhitespace(in_RDI);
                  if (bVar3) {
                    local_168 = Parse(in_stack_ffffffffffffffe8);
                    if (local_168 == (JSONValue *)0x0) {
                      std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                      ::_Rb_tree_iterator(&local_170);
                      local_178 = (_Base_ptr)
                                  std::
                                  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                  ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                           *)in_stack_fffffffffffffc08);
                      local_170._M_node = local_178;
                      while( true ) {
                        local_180._M_node =
                             (_Base_ptr)
                             std::
                             map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                             ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc08);
                        bVar3 = std::operator!=(&local_170,&local_180);
                        if (!bVar3) break;
                        ppVar5 = std::
                                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                              *)0x25997b);
                        pJVar10 = ppVar5->second;
                        if (pJVar10 != (JSONValue *)0x0) {
                          ~JSONValue(in_stack_fffffffffffffc70);
                          operator_delete(pJVar10);
                        }
                        local_188 = (_Base_ptr)
                                    std::
                                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                                  *)in_stack_fffffffffffffc18,
                                                 (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
                      }
                      local_8 = (JSONValue *)0x0;
                      local_40 = 1;
                    }
                    else {
                      local_190._M_node =
                           (_Base_ptr)
                           std::
                           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                           ::find((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                   *)in_stack_fffffffffffffc08,(key_type *)0x2599f6);
                      local_198._M_node =
                           (_Base_ptr)
                           std::
                           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                           ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                  *)in_stack_fffffffffffffc08);
                      bVar3 = std::operator!=(&local_190,&local_198);
                      if (bVar3) {
                        ppJVar7 = std::
                                  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                  ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                                *)CONCAT17(in_stack_fffffffffffffc57,
                                                           in_stack_fffffffffffffc50),
                                               in_stack_fffffffffffffc48);
                        pJVar2 = *ppJVar7;
                        if (pJVar2 != (mapped_type)0x0) {
                          ~JSONValue(in_stack_fffffffffffffc70);
                          operator_delete(pJVar2);
                        }
                      }
                      pJVar10 = local_168;
                      ppJVar7 = std::
                                map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                              *)CONCAT17(in_stack_fffffffffffffc57,
                                                         in_stack_fffffffffffffc50),
                                             in_stack_fffffffffffffc48);
                      *ppJVar7 = pJVar10;
                      bVar3 = JSON::SkipWhitespace(in_RDI);
                      if (bVar3) {
                        if (**in_RDI == L'}') {
                          *in_RDI = *in_RDI + 1;
                          local_8 = (JSONValue *)operator_new(0x10);
                          JSONValue(in_stack_fffffffffffffc30,
                                    (JSONObject *)
                                    CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
                          local_40 = 1;
                        }
                        else if (**in_RDI == L',') {
                          *in_RDI = *in_RDI + 1;
                          local_40 = 0;
                        }
                        else {
                          std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                          ::_Rb_tree_iterator(&local_1c0);
                          local_1c8 = (_Base_ptr)
                                      std::
                                      map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                      ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                               *)in_stack_fffffffffffffc08);
                          local_1c0._M_node = local_1c8;
                          while( true ) {
                            local_1d0._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                 ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                        *)in_stack_fffffffffffffc08);
                            bVar3 = std::operator!=(&local_1c0,&local_1d0);
                            if (!bVar3) break;
                            ppVar5 = std::
                                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                     ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                                  *)0x259cc4);
                            pJVar10 = ppVar5->second;
                            if (pJVar10 != (JSONValue *)0x0) {
                              ~JSONValue(in_stack_fffffffffffffc70);
                              operator_delete(pJVar10);
                            }
                            local_1d8 = (_Base_ptr)
                                        std::
                                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                        ::operator++((
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                                  *)in_stack_fffffffffffffc18,
                                                  (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
                          }
                          local_8 = (JSONValue *)0x0;
                          local_40 = 1;
                        }
                      }
                      else {
                        std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                        ::_Rb_tree_iterator(&local_1a0);
                        local_1a8 = (_Base_ptr)
                                    std::
                                    map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                    ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                             *)in_stack_fffffffffffffc08);
                        local_1a0._M_node = local_1a8;
                        while( true ) {
                          local_1b0._M_node =
                               (_Base_ptr)
                               std::
                               map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                               ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                      *)in_stack_fffffffffffffc08);
                          bVar3 = std::operator!=(&local_1a0,&local_1b0);
                          if (!bVar3) break;
                          ppVar5 = std::
                                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                   ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                                *)0x259b60);
                          in_stack_fffffffffffffc70 = ppVar5->second;
                          if (in_stack_fffffffffffffc70 != (JSONValue *)0x0) {
                            ~JSONValue(in_stack_fffffffffffffc70);
                            operator_delete(in_stack_fffffffffffffc70);
                          }
                          local_1b8 = (_Base_ptr)
                                      std::
                                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                      ::operator++((
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                                  *)in_stack_fffffffffffffc18,
                                                  (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
                        }
                        local_8 = (JSONValue *)0x0;
                        local_40 = 1;
                      }
                    }
                  }
                  else {
                    std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                    ::_Rb_tree_iterator(&local_148);
                    local_150 = (_Base_ptr)
                                std::
                                map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                         *)in_stack_fffffffffffffc08);
                    local_148._M_node = local_150;
                    while( true ) {
                      local_158._M_node =
                           (_Base_ptr)
                           std::
                           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                           ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                  *)in_stack_fffffffffffffc08);
                      bVar3 = std::operator!=(&local_148,&local_158);
                      if (!bVar3) break;
                      ppVar5 = std::
                               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                            *)0x259870);
                      pJVar10 = ppVar5->second;
                      if (pJVar10 != (JSONValue *)0x0) {
                        ~JSONValue(in_stack_fffffffffffffc70);
                        operator_delete(pJVar10);
                      }
                      local_160 = (_Base_ptr)
                                  std::
                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                  ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                                *)in_stack_fffffffffffffc18,
                                               (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
                    }
                    local_8 = (JSONValue *)0x0;
                    local_40 = 1;
                  }
                }
                else {
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                  ::_Rb_tree_iterator(&local_128);
                  local_130 = (_Base_ptr)
                              std::
                              map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                              ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                       *)in_stack_fffffffffffffc08);
                  local_128._M_node = local_130;
                  while( true ) {
                    local_138._M_node =
                         (_Base_ptr)
                         std::
                         map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                         ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                *)in_stack_fffffffffffffc08);
                    bVar3 = std::operator!=(&local_128,&local_138);
                    if (!bVar3) break;
                    ppVar5 = std::
                             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                          *)0x259774);
                    pJVar10 = ppVar5->second;
                    if (pJVar10 != (JSONValue *)0x0) {
                      ~JSONValue(in_stack_fffffffffffffc70);
                      operator_delete(pJVar10);
                    }
                    local_140 = (_Base_ptr)
                                std::
                                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                              *)in_stack_fffffffffffffc18,
                                             (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
                  }
                  local_8 = (JSONValue *)0x0;
                  local_40 = 1;
                }
              }
              else {
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                ::_Rb_tree_iterator(&local_108);
                local_110 = (_Base_ptr)
                            std::
                            map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                            ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                     *)in_stack_fffffffffffffc08);
                local_108._M_node = local_110;
                while( true ) {
                  local_118._M_node =
                       (_Base_ptr)
                       std::
                       map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                       ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                              *)in_stack_fffffffffffffc08);
                  bVar3 = std::operator!=(&local_108,&local_118);
                  if (!bVar3) break;
                  ppVar5 = std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                           ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                        *)0x259681);
                  pJVar10 = ppVar5->second;
                  if (pJVar10 != (JSONValue *)0x0) {
                    ~JSONValue(in_stack_fffffffffffffc70);
                    operator_delete(pJVar10);
                  }
                  local_120 = (_Base_ptr)
                              std::
                              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                              ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                            *)in_stack_fffffffffffffc18,
                                           (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
                }
                local_8 = (JSONValue *)0x0;
                local_40 = 1;
              }
            }
            else {
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
              ::_Rb_tree_iterator(&local_e8);
              local_f0 = (_Base_ptr)
                         std::
                         map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                         ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                  *)in_stack_fffffffffffffc08);
              local_e8._M_node = local_f0;
              while( true ) {
                local_f8._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                     ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                            *)in_stack_fffffffffffffc08);
                bVar3 = std::operator!=(&local_e8,&local_f8);
                if (!bVar3) break;
                ppVar5 = std::
                         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                         ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                      *)0x25956c);
                pJVar10 = ppVar5->second;
                if (pJVar10 != (JSONValue *)0x0) {
                  ~JSONValue(in_stack_fffffffffffffc70);
                  operator_delete(pJVar10);
                }
                local_100 = (_Base_ptr)
                            std::
                            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                            ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                          *)in_stack_fffffffffffffc18,
                                         (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
              }
              local_8 = (JSONValue *)0x0;
              local_40 = 1;
            }
            std::__cxx11::wstring::~wstring(local_e0);
            if (local_40 != 0) goto LAB_00259e31;
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
          ::_Rb_tree_iterator(&local_1e0);
          local_1e8 = (_Base_ptr)
                      std::
                      map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                      ::begin((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                               *)in_stack_fffffffffffffc08);
          local_1e0._M_node = local_1e8;
          while( true ) {
            local_1f0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                 ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                        *)in_stack_fffffffffffffc08);
            bVar3 = std::operator!=(&local_1e0,&local_1f0);
            if (!bVar3) break;
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                     ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                  *)0x259ddc);
            pJVar10 = ppVar5->second;
            if (pJVar10 != (JSONValue *)0x0) {
              ~JSONValue(in_stack_fffffffffffffc70);
              operator_delete(pJVar10);
            }
            local_1f8 = (_Base_ptr)
                        std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                                      *)in_stack_fffffffffffffc18,
                                     (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
          }
          local_8 = (JSONValue *)0x0;
          local_40 = 1;
LAB_00259e31:
          std::
          map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
          ::~map((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                  *)0x259e3e);
          return local_8;
        }
        if (**in_RDI == L'[') {
          std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::vector
                    ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)0x259e76);
          *in_RDI = *in_RDI + 1;
          while (**in_RDI != L'\0') {
            bVar3 = JSON::SkipWhitespace(in_RDI);
            if (!bVar3) {
              __gnu_cxx::
              __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
              ::__normal_iterator(&local_218);
              local_220 = (JSONValue **)
                          std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::begin
                                    ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                     in_stack_fffffffffffffc08);
              local_218._M_current = local_220;
              while( true ) {
                local_228 = (JSONValue **)
                            std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                                      ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                       in_stack_fffffffffffffc08);
                bVar3 = __gnu_cxx::operator!=
                                  ((__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc10,
                                   (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc08);
                if (!bVar3) break;
                ppJVar8 = __gnu_cxx::
                          __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                          ::operator*(&local_218);
                pJVar10 = *ppJVar8;
                if (pJVar10 != (JSONValue *)0x0) {
                  ~JSONValue(in_stack_fffffffffffffc70);
                  operator_delete(pJVar10);
                }
                local_230 = (JSONValue **)
                            __gnu_cxx::
                            __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                            ::operator++(in_stack_fffffffffffffc18,
                                         (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
              }
              local_8 = (JSONValue *)0x0;
              goto LAB_0025a46e;
            }
            sVar9 = std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::size(&local_210);
            if ((sVar9 == 0) && (**in_RDI == L']')) {
              *in_RDI = *in_RDI + 1;
              local_8 = (JSONValue *)operator_new(0x10);
              JSONValue(in_stack_fffffffffffffc30,
                        (JSONArray *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
              goto LAB_0025a46e;
            }
            local_238 = Parse(in_stack_ffffffffffffffe8);
            if (local_238 == (JSONValue *)0x0) {
              __gnu_cxx::
              __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
              ::__normal_iterator(&local_240);
              local_248 = (JSONValue **)
                          std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::begin
                                    ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                     in_stack_fffffffffffffc08);
              local_240._M_current = local_248;
              while( true ) {
                local_250 = (JSONValue **)
                            std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                                      ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                       in_stack_fffffffffffffc08);
                bVar3 = __gnu_cxx::operator!=
                                  ((__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc10,
                                   (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc08);
                if (!bVar3) break;
                ppJVar8 = __gnu_cxx::
                          __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                          ::operator*(&local_240);
                pJVar10 = *ppJVar8;
                if (pJVar10 != (JSONValue *)0x0) {
                  ~JSONValue(in_stack_fffffffffffffc70);
                  operator_delete(pJVar10);
                }
                local_258 = (JSONValue **)
                            __gnu_cxx::
                            __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                            ::operator++(in_stack_fffffffffffffc18,
                                         (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
              }
              local_8 = (JSONValue *)0x0;
              goto LAB_0025a46e;
            }
            std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::push_back
                      ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                       in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
            in_stack_fffffffffffffc2f = JSON::SkipWhitespace(in_RDI);
            if (!(bool)in_stack_fffffffffffffc2f) {
              __gnu_cxx::
              __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
              ::__normal_iterator(&local_260);
              local_268 = (JSONValue **)
                          std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::begin
                                    ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                     in_stack_fffffffffffffc08);
              local_260._M_current = local_268;
              while( true ) {
                local_270 = (JSONValue **)
                            std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                                      ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                       in_stack_fffffffffffffc08);
                bVar3 = __gnu_cxx::operator!=
                                  ((__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc10,
                                   (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc08);
                if (!bVar3) break;
                ppJVar8 = __gnu_cxx::
                          __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                          ::operator*(&local_260);
                in_stack_fffffffffffffc20 = *ppJVar8;
                if (in_stack_fffffffffffffc20 != (JSONValue *)0x0) {
                  ~JSONValue(in_stack_fffffffffffffc70);
                  operator_delete(in_stack_fffffffffffffc20);
                }
                local_278 = (JSONValue **)
                            __gnu_cxx::
                            __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                            ::operator++(in_stack_fffffffffffffc18,
                                         (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
              }
              local_8 = (JSONValue *)0x0;
              goto LAB_0025a46e;
            }
            if (**in_RDI == L']') {
              *in_RDI = *in_RDI + 1;
              local_8 = (JSONValue *)operator_new(0x10);
              JSONValue(in_stack_fffffffffffffc30,
                        (JSONArray *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
              goto LAB_0025a46e;
            }
            if (**in_RDI != L',') {
              __gnu_cxx::
              __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
              ::__normal_iterator(&local_280);
              local_288 = (JSONValue **)
                          std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::begin
                                    ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                     in_stack_fffffffffffffc08);
              local_280._M_current = local_288;
              while( true ) {
                local_290 = (JSONValue **)
                            std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                                      ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                                       in_stack_fffffffffffffc08);
                bVar3 = __gnu_cxx::operator!=
                                  ((__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc10,
                                   (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                    *)in_stack_fffffffffffffc08);
                if (!bVar3) break;
                ppJVar8 = __gnu_cxx::
                          __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                          ::operator*(&local_280);
                in_stack_fffffffffffffc10 = *ppJVar8;
                if (in_stack_fffffffffffffc10 != (JSONValue *)0x0) {
                  ~JSONValue(in_stack_fffffffffffffc70);
                  operator_delete(in_stack_fffffffffffffc10);
                }
                local_298 = (JSONValue **)
                            __gnu_cxx::
                            __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                            ::operator++(in_stack_fffffffffffffc18,
                                         (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
              }
              local_8 = (JSONValue *)0x0;
              goto LAB_0025a46e;
            }
            *in_RDI = *in_RDI + 1;
          }
          __gnu_cxx::
          __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>::
          __normal_iterator(&local_2a0);
          local_2a0._M_current =
               (JSONValue **)
               std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::begin
                         ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                          in_stack_fffffffffffffc08);
          while( true ) {
            std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                      ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                       in_stack_fffffffffffffc08);
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                *)in_stack_fffffffffffffc10,
                               (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                                *)in_stack_fffffffffffffc08);
            if (!bVar3) break;
            ppJVar8 = __gnu_cxx::
                      __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                      ::operator*(&local_2a0);
            in_stack_fffffffffffffc08 = *ppJVar8;
            if (in_stack_fffffffffffffc08 != (JSONValue *)0x0) {
              ~JSONValue(in_stack_fffffffffffffc70);
              operator_delete(in_stack_fffffffffffffc08);
            }
            __gnu_cxx::
            __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
            ::operator++(in_stack_fffffffffffffc18,(int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
          }
          local_8 = (JSONValue *)0x0;
LAB_0025a46e:
          local_40 = 1;
          std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::~vector
                    ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)in_stack_fffffffffffffc20)
          ;
        }
        else {
          local_8 = (JSONValue *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

JSONValue *JSONValue::Parse(const wchar_t **data)
{
	// Is it a string?
	if (**data == '"')
	{
		std::wstring str;
		if (!JSON::ExtractString(&(++(*data)), str))
			return NULL;
		else
			return new JSONValue(str);
	}

	// Is it a boolean?
	else if ((simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"true", 4) == 0) || (simplejson_wcsnlen(*data, 5) && wcsncasecmp(*data, L"false", 5) == 0))
	{
		bool value = wcsncasecmp(*data, L"true", 4) == 0;
		(*data) += value ? 4 : 5;
		return new JSONValue(value);
	}

	// Is it a null?
	else if (simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"null", 4) == 0)
	{
		(*data) += 4;
		return new JSONValue();
	}

	// Is it a number?
	else if (**data == L'-' || (**data >= L'0' && **data <= L'9'))
	{
		// Negative?
		bool neg = **data == L'-';
		if (neg) (*data)++;

		double number = 0.0;

		// Parse the whole part of the number - only if it wasn't 0
		if (**data == L'0')
			(*data)++;
		else if (**data >= L'1' && **data <= L'9')
			number = JSON::ParseInt(data);
		else
			return NULL;

		// Could be a decimal now...
		if (**data == '.')
		{
			(*data)++;

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Find the decimal and sort the decimal place out
			// Use ParseDecimal as ParseInt won't work with decimals less than 0.1
			// thanks to Javier Abadia for the report & fix
			double decimal = JSON::ParseDecimal(data);

			// Save the number
			number += decimal;
		}

		// Could be an exponent now...
		if (**data == L'E' || **data == L'e')
		{
			(*data)++;

			// Check signage of expo
			bool neg_expo = false;
			if (**data == L'-' || **data == L'+')
			{
				neg_expo = **data == L'-';
				(*data)++;
			}

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Sort the expo out
			double expo = JSON::ParseInt(data);
			for (double i = 0.0; i < expo; i++)
				number = neg_expo ? (number / 10.0) : (number * 10.0);
		}

		// Was it neg?
		if (neg) number *= -1;

		return new JSONValue(number);
	}

	// An object?
	else if (**data == L'{')
	{
		JSONObject object;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Special case - empty object
			if (object.size() == 0 && **data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// We want a string now...
			std::wstring name;
			if (!JSON::ExtractString(&(++(*data)), name))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Need a : now
			if (*((*data)++) != L':')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// The value is here
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Add the name:value
			if (object.find(name) != object.end())
				delete object[name];
			object[name] = value;

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// End of object?
			if (**data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_OBJECT(object);
		return NULL;
	}

	// An array?
	else if (**data == L'[')
	{
		JSONArray array;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Special case - empty array
			if (array.size() == 0 && **data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Get the value
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Add the value
			array.push_back(value);

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// End of array?
			if (**data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_ARRAY(array);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_ARRAY(array);
		return NULL;
	}

	// Ran out of possibilites, it's bad!
	else
	{
		return NULL;
	}
}